

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::createBuffers
          (MultipleBindingCase *this)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  MultipleBindingCase *pMVar5;
  byte bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  long lVar9;
  int iVar10;
  ulong uVar11;
  GLuint *pGVar12;
  long lVar13;
  int x_1;
  uint uVar14;
  ulong uVar15;
  float *pfVar16;
  long lVar17;
  undefined8 *puVar18;
  float *pfVar19;
  pointer pVVar20;
  int y;
  Vec4 *color;
  size_type __n;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> primitiveData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorOffsetData;
  undefined8 local_88;
  undefined8 uStack_80;
  long local_70;
  MultipleBindingCase *local_68;
  pointer local_60;
  Vector<float,_4> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar7 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_88 = 0x3f80000000000000;
  uStack_80 = 0x3f80000000000000;
  local_48 = 0x3f8000003f800000;
  uStack_40 = 0x3f80000000000000;
  bVar2 = (this->m_spec).instanced;
  uVar14 = 0x12c0;
  if (bVar2 != false) {
    uVar14 = 800;
  }
  uVar11 = 2;
  if ((this->m_spec).zeroStride == false) {
    uVar11 = (ulong)uVar14;
  }
  bVar3 = (this->m_spec).aliasingBuffers;
  uVar15 = 0;
  if (bVar3 != false) {
    uVar15 = uVar11;
  }
  uVar14 = (int)uVar15 + 0x960;
  if (bVar2 != false) {
    uVar14 = (int)uVar15 + 6;
  }
  __n = 0;
  if (bVar3 == false) {
    __n = uVar11;
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&primitiveData,(ulong)uVar14,(allocator_type *)&colorOffsetData);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&colorOffsetData,__n,(allocator_type *)&local_58);
  if ((this->m_spec).aliasingBuffers == true) {
    bVar6 = (this->m_spec).instanced;
    if ((bool)bVar6 == true) {
      pVVar20 = primitiveData.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start + 6;
    }
    else {
      pVVar20 = primitiveData.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start + 0x960;
    }
  }
  else {
    bVar6 = (this->m_spec).instanced;
    pVVar20 = colorOffsetData.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if ((bVar6 & 1) == 0) {
    lVar9 = 0;
    lVar17 = 0;
    while (lVar17 != 0x14) {
      fVar21 = (float)(int)lVar17 / 20.0;
      fVar21 = fVar21 + fVar21 + -1.0;
      lVar17 = lVar17 + 1;
      fVar22 = (float)(int)lVar17 / 20.0;
      fVar22 = fVar22 + fVar22 + -1.0;
      iVar10 = 0;
      for (lVar13 = 0; lVar13 != 0x780; lVar13 = lVar13 + 0x60) {
        fVar23 = (float)iVar10 / 20.0 + (float)iVar10 / 20.0 + -1.0;
        *(float *)((long)(primitiveData.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + lVar9) =
             fVar23;
        *(float *)((long)(primitiveData.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 4 + lVar9) =
             fVar21;
        *(undefined8 *)
         ((long)(primitiveData.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + 8 + lVar9) =
             0x3f80000000000000;
        *(float *)((long)primitiveData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar9 + lVar13) =
             fVar23;
        *(float *)((long)primitiveData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar13 + lVar9 + 4) =
             fVar22;
        *(undefined8 *)
         ((long)primitiveData.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[1].m_data + lVar13 + lVar9 + 8) =
             0x3f80000000000000;
        iVar10 = iVar10 + 1;
        fVar24 = (float)iVar10 / 20.0 + (float)iVar10 / 20.0 + -1.0;
        *(float *)((long)primitiveData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar9 + lVar13) =
             fVar24;
        *(float *)((long)primitiveData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar13 + lVar9 + 4) =
             fVar22;
        *(undefined8 *)
         ((long)primitiveData.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[2].m_data + lVar13 + lVar9 + 8) =
             0x3f80000000000000;
        *(float *)((long)primitiveData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar9 + lVar13) =
             fVar23;
        *(float *)((long)primitiveData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar13 + lVar9 + 4) =
             fVar21;
        *(undefined8 *)
         ((long)primitiveData.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[3].m_data + lVar13 + lVar9 + 8) =
             0x3f80000000000000;
        *(float *)((long)primitiveData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar9 + lVar13) =
             fVar24;
        *(float *)((long)primitiveData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar13 + lVar9 + 4) =
             fVar22;
        *(undefined8 *)
         ((long)primitiveData.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[4].m_data + lVar13 + lVar9 + 8) =
             0x3f80000000000000;
        *(float *)((long)primitiveData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[5].m_data + lVar9 + lVar13) =
             fVar24;
        *(float *)((long)primitiveData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[5].m_data + lVar13 + lVar9 + 4) =
             fVar21;
        *(undefined8 *)
         ((long)primitiveData.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[5].m_data + lVar13 + lVar9 + 8) =
             0x3f80000000000000;
      }
      lVar9 = lVar9 + 0x780;
    }
  }
  else {
    (primitiveData.
     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
     super__Vector_impl_data._M_start)->m_data[0] = 0.0;
    (primitiveData.
     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
     super__Vector_impl_data._M_start)->m_data[1] = 0.0;
    (primitiveData.
     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
     super__Vector_impl_data._M_start)->m_data[2] = 0.0;
    (primitiveData.
     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
     super__Vector_impl_data._M_start)->m_data[3] = 1.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].m_data[0] = 0.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].m_data[1] = 0.1;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].m_data[0] = 0.1;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].m_data[1] = 0.1;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].m_data[0] = 0.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].m_data[1] = 0.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].m_data[0] = 0.1;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].m_data[1] = 0.1;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].m_data[0] = 0.1;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].m_data[1] = 0.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
    primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
  }
  local_70 = CONCAT44(extraout_var,iVar7);
  local_68 = this;
  if ((this->m_spec).zeroStride == true) {
    *(undefined8 *)pVVar20->m_data = local_88;
    *(undefined8 *)(pVVar20->m_data + 2) = uStack_80;
    tcu::Vector<float,_4>::Vector(&local_58,0.0);
    pVVar20[1].m_data[0] = local_58.m_data[0];
    pVVar20[1].m_data[1] = local_58.m_data[1];
    pVVar20[1].m_data[2] = local_58.m_data[2];
    pVVar20[1].m_data[3] = local_58.m_data[3];
  }
  else if ((this->m_spec).instanced == false) {
    for (lVar9 = 0; lVar9 != 0x14; lVar9 = lVar9 + 1) {
      local_60 = pVVar20;
      for (lVar17 = 0; lVar17 != 0x14; lVar17 = lVar17 + 1) {
        puVar18 = &local_48;
        if (((int)lVar17 + (int)lVar9 & 1U) == 0) {
          puVar18 = &local_88;
        }
        for (lVar13 = 0x10; lVar13 != 0xd0; lVar13 = lVar13 + 0x20) {
          uVar4 = puVar18[1];
          puVar1 = (undefined8 *)((long)pVVar20[-1].m_data + lVar13);
          *puVar1 = *puVar18;
          puVar1[1] = uVar4;
          tcu::Vector<float,_4>::Vector(&local_58,0.0);
          pfVar19 = (float *)((long)pVVar20->m_data + lVar13);
          *pfVar19 = local_58.m_data[0];
          pfVar19[1] = local_58.m_data[1];
          pfVar19[2] = local_58.m_data[2];
          pfVar19[3] = local_58.m_data[3];
        }
        pVVar20 = pVVar20 + 0xc;
      }
      pVVar20 = local_60 + 0xf0;
    }
  }
  else {
    pfVar19 = pVVar20[1].m_data + 2;
    for (lVar9 = 0; lVar9 != 0x14; lVar9 = lVar9 + 1) {
      fVar21 = (float)(int)lVar9 / 20.0;
      pfVar16 = pfVar19;
      for (lVar17 = 0; lVar17 != 0x14; lVar17 = lVar17 + 1) {
        puVar18 = &local_48;
        if (((int)lVar9 + (int)lVar17 & 1U) == 0) {
          puVar18 = &local_88;
        }
        uVar4 = puVar18[1];
        *(undefined8 *)(pfVar16 + -6) = *puVar18;
        *(undefined8 *)(pfVar16 + -4) = uVar4;
        fVar22 = (float)(int)lVar17 / 20.0;
        ((Vector<float,_4> *)(pfVar16 + -2))->m_data[0] = fVar22 + fVar22 + -1.0;
        pfVar16[-1] = fVar21 + fVar21 + -1.0;
        pfVar16[0] = 0.0;
        pfVar16[1] = 0.0;
        pfVar16 = pfVar16 + 8;
      }
      pfVar19 = pfVar19 + 0xa0;
    }
  }
  pMVar5 = local_68;
  lVar9 = local_70;
  pGVar12 = &local_68->m_primitiveBuf;
  (**(code **)(local_70 + 0x6c8))(1,pGVar12);
  (**(code **)(lVar9 + 0x40))(0x8892,*pGVar12);
  (**(code **)(lVar9 + 0x150))
            (0x8892,(long)((int)primitiveData.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)primitiveData.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             primitiveData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"upload data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x31c);
  if ((pMVar5->m_spec).aliasingBuffers == false) {
    pGVar12 = &pMVar5->m_colorOffsetBuf;
    (**(code **)(lVar9 + 0x6c8))(1,pGVar12);
    (**(code **)(lVar9 + 0x40))(0x8892,*pGVar12);
    (**(code **)(lVar9 + 0x150))
              (0x8892,(long)((int)colorOffsetData.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (int)colorOffsetData.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
               colorOffsetData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"upload colordata",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x325);
  }
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&colorOffsetData.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&primitiveData.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return;
}

Assistant:

void MultipleBindingCase::createBuffers (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const tcu::Vec4			green				= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			yellow				= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);

	const int				vertexDataSize		= (m_spec.instanced) ? (6) : (6 * GRID_SIZE * GRID_SIZE);
	const int				offsetColorSize		= (m_spec.zeroStride) ? (2) : (m_spec.instanced) ? (2 * GRID_SIZE * GRID_SIZE) : (2 * 6 * GRID_SIZE * GRID_SIZE);
	const int				primitiveBufSize	= (m_spec.aliasingBuffers) ? (vertexDataSize + offsetColorSize) : (vertexDataSize);
	const int				colorOffsetBufSize	= (m_spec.aliasingBuffers) ? (0) : (offsetColorSize);

	std::vector<tcu::Vec4>	primitiveData		(primitiveBufSize);
	std::vector<tcu::Vec4>	colorOffsetData		(colorOffsetBufSize);
	tcu::Vec4*				colorOffsetWritePtr = DE_NULL;

	if (m_spec.aliasingBuffers)
	{
		if (m_spec.instanced)
			colorOffsetWritePtr = &primitiveData[6];
		else
			colorOffsetWritePtr = &primitiveData[GRID_SIZE*GRID_SIZE*6];
	}
	else
		colorOffsetWritePtr = &colorOffsetData[0];

	// write vertex position

	if (m_spec.instanced)
	{
		// store single basic primitive
		primitiveData[0] = tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		primitiveData[1] = tcu::Vec4(0.0f,				2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[2] = tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[3] = tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		primitiveData[4] = tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[5] = tcu::Vec4(2.0f / GRID_SIZE,	0.0f,				0.0f, 1.0f);
	}
	else
	{
		// store whole grid
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		{
			primitiveData[(y * GRID_SIZE + x) * 6 + 0] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 1] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 2] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 3] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 4] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 5] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
		}
	}

	// store color&offset

	if (m_spec.zeroStride)
	{
		colorOffsetWritePtr[0] = green;
		colorOffsetWritePtr[1] = tcu::Vec4(0.0f);
	}
	else if (m_spec.instanced)
	{
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetWritePtr[(y * GRID_SIZE + x) * 2 + 0] = color;
			colorOffsetWritePtr[(y * GRID_SIZE + x) * 2 + 1] = tcu::Vec4(float(x) / float(GRID_SIZE) * 2.0f - 1.0f, float(y) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 0.0f);
		}
	}
	else
	{
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		for (int v = 0; v < 6; ++v)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetWritePtr[((y * GRID_SIZE + x) * 6 + v) * 2 + 0] = color;
			colorOffsetWritePtr[((y * GRID_SIZE + x) * 6 + v) * 2 + 1] = tcu::Vec4(0.0f);
		}
	}

	// upload vertex data

	gl.genBuffers(1, &m_primitiveBuf);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_primitiveBuf);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(primitiveData.size() * sizeof(tcu::Vec4)), primitiveData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload data");

	if (!m_spec.aliasingBuffers)
	{
		// upload color & offset data

		gl.genBuffers(1, &m_colorOffsetBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_colorOffsetBuf);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(colorOffsetData.size() * sizeof(tcu::Vec4)), colorOffsetData[0].getPtr(), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "upload colordata");
	}
}